

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters.h
# Opt level: O0

void __thiscall lwlog::details::time_formatter::~time_formatter(time_formatter *this)

{
  time_formatter *this_local;
  
  ~time_formatter(this);
  operator_delete(this,8);
  return;
}

Assistant:

void format(std::string& pattern, const record_base& record) const override
		{
			const auto& time_point{ record.time_point() };

			formatter::format_attribute(
				pattern,
				flag::time,
				os::datetime::ensure_two_digit_format(time_point.hour)
					+ ':' + os::datetime::ensure_two_digit_format(time_point.minute)
					+ ':' + os::datetime::ensure_two_digit_format(time_point.second)
			);
		}